

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTestCase.cpp
# Opt level: O0

void __thiscall SuiteDictionaryTests::TestsetGetString::TestsetGetString(TestsetGetString *this)

{
  char *suiteName;
  TestsetGetString *this_local;
  
  suiteName = SuiteDictionaryTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"setGetString",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DictionaryTestCase.cpp"
             ,0x3f);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestsetGetString_004572b0;
  return;
}

Assistant:

TEST(setGetString)
{
  Dictionary object;
  object.setString( "STRINGKEY1", "STRINGVALUE1" );
  object.setString( "STRINGKEY2", "stringvalue2" );

  CHECK_EQUAL( "STRINGVALUE1", object.getString( "STRINGKEY1" ) );
  CHECK_EQUAL( "stringvalue2", object.getString( "STRINGKEY2" )  );
  CHECK_EQUAL( "STRINGVALUE2", object.getString( "STRINGKEY2", true ) );
  CHECK_THROW( object.getString( "STRINGKEY3" ), ConfigError );
}